

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::EntryPointInfo::RecordNativeMap(EntryPointInfo *this,uint32 nativeOffset,uint32 statementIndex)

{
  int iVar1;
  NativeEntryPointData *this_00;
  NativeOffsetMapListType *this_01;
  Type *pTVar2;
  undefined1 local_5c [8];
  NativeOffsetMap map;
  NativeOffsetMap *previous;
  int count;
  NativeOffsetMapListType *nativeOffsetMaps;
  uint32 statementIndex_local;
  uint32 nativeOffset_local;
  EntryPointInfo *this_local;
  
  this_00 = GetNativeEntryPointData(this);
  this_01 = NativeEntryPointData::GetNativeOffsetMaps(this_00);
  iVar1 = JsUtil::
          ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
          ::Count(&this_01->
                   super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
                 );
  if ((iVar1 != 0) &&
     (pTVar2 = JsUtil::
               List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,iVar1 + -1),
     (pTVar2->nativeOffsetSpan).begin == (pTVar2->nativeOffsetSpan).end)) {
    if (pTVar2->statementIndex == statementIndex) {
      return;
    }
    if ((pTVar2->nativeOffsetSpan).begin == nativeOffset) {
      if (statementIndex == 0xffffffff) {
        JsUtil::
        List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::RemoveAtEnd(this_01);
        return;
      }
      pTVar2->statementIndex = statementIndex;
      return;
    }
    (pTVar2->nativeOffsetSpan).end = nativeOffset;
  }
  if (statementIndex != 0xffffffff) {
    NativeEntryPointData::NativeOffsetMap::NativeOffsetMap((NativeOffsetMap *)local_5c);
    local_5c._0_4_ = statementIndex;
    local_5c._4_4_ = nativeOffset;
    map.statementIndex = nativeOffset;
    JsUtil::
    List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this_01,(NativeOffsetMap *)local_5c);
  }
  return;
}

Assistant:

void
    EntryPointInfo::RecordNativeMap(uint32 nativeOffset, uint32 statementIndex)
    {
        auto& nativeOffsetMaps = this->GetNativeEntryPointData()->GetNativeOffsetMaps();
        int count = nativeOffsetMaps.Count();
        if (count)
        {
            NativeEntryPointData::NativeOffsetMap* previous = &nativeOffsetMaps.Item(count-1);
            // Check if the range is still not finished.
            if (previous->nativeOffsetSpan.begin == previous->nativeOffsetSpan.end)
            {
                if (previous->statementIndex == statementIndex)
                {
                    // If the statement index is the same, we can continue with the previous range
                    return;
                }

                // If the range is empty, replace the previous range.
                if ((uint32)previous->nativeOffsetSpan.begin == nativeOffset)
                {
                    if (statementIndex == Js::Constants::NoStatementIndex)
                    {
                        nativeOffsetMaps.RemoveAtEnd();
                    }
                    else
                    {
                        previous->statementIndex = statementIndex;
                    }
                    return;
                }

                // Close the previous range
                previous->nativeOffsetSpan.end = nativeOffset;
            }
        }

        if (statementIndex == Js::Constants::NoStatementIndex)
        {
            // We do not explicitly record the offsets that do not map to user code.
            return;
        }

        NativeEntryPointData::NativeOffsetMap map;
        map.statementIndex = statementIndex;
        map.nativeOffsetSpan.begin = nativeOffset;
        map.nativeOffsetSpan.end = nativeOffset;

        nativeOffsetMaps.Add(map);
    }